

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O2

pool_ptr<soul::heart::ProcessorInstance> __thiscall
soul::heart::Parser::findProcessorInstance(Parser *this,string *instanceName)

{
  pointer ppVar1;
  ProcessorInstance *pPVar2;
  __type_conflict1 _Var3;
  Module *pMVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_00;
  pointer ppVar5;
  CompileMessage CStack_68;
  
  (this->
  super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>)
  ._vptr_Tokeniser = (_func_int **)0x0;
  pMVar4 = pool_ptr<soul::Module>::operator->
                     ((pool_ptr<soul::Module> *)&instanceName[4]._M_string_length);
  ppVar5 = (pMVar4->processorInstances).
           super__Vector_base<soul::pool_ref<soul::heart::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::heart::ProcessorInstance>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (pMVar4->processorInstances).
           super__Vector_base<soul::pool_ref<soul::heart::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::heart::ProcessorInstance>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  args = extraout_RDX;
  do {
    if (ppVar5 == ppVar1) goto LAB_0024f3f0;
    pPVar2 = ppVar5->object;
    _Var3 = std::operator==(&pPVar2->instanceName,in_RDX);
    ppVar5 = ppVar5 + 1;
    args = extraout_RDX_00;
  } while (!_Var3);
  (this->
  super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>)
  ._vptr_Tokeniser = (_func_int **)pPVar2;
  if (pPVar2 == (ProcessorInstance *)0x0) {
LAB_0024f3f0:
    Errors::cannotFindProcessor<std::__cxx11::string_const&>(&CStack_68,(Errors *)in_RDX,args);
    (**(code **)((instanceName->_M_dataplus)._M_p + 0x10))(instanceName,&CStack_68);
    CompileMessage::~CompileMessage(&CStack_68);
  }
  return (pool_ptr<soul::heart::ProcessorInstance>)(ProcessorInstance *)this;
}

Assistant:

pool_ptr<heart::ProcessorInstance> findProcessorInstance (const std::string& instanceName)
    {
        pool_ptr<heart::ProcessorInstance> result;

        for (auto m : module->processorInstances)
        {
            if (m->instanceName == instanceName)
            {
                result = m;
                break;
            }
        }

        if (result == nullptr)
            throwError (Errors::cannotFindProcessor (instanceName));

        return result;
    }